

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall
Eigen::internal::
gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
::operator()(gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
             *this,float *blockB,const_blas_data_mapper<float,_long,_0> *rhs,long depth,long cols,
            long stride,long offset)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long j2;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x958,
                  "void Eigen::internal::gemm_pack_rhs<float, long, Eigen::internal::const_blas_data_mapper<float, long, 0>, 4, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = float, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<float, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar19 = cols + 3;
  if (-1 < cols) {
    uVar19 = cols;
  }
  uVar27 = uVar19 & 0xfffffffffffffffc;
  uVar26 = depth + 3;
  if (-1 < depth) {
    uVar26 = depth;
  }
  if (cols < 4) {
    lVar25 = 0;
  }
  else {
    lVar23 = 0xc;
    lVar22 = 8;
    lVar31 = 4;
    lVar28 = 0;
    lVar29 = 0;
    lVar25 = 0;
    do {
      pfVar20 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
      lVar3 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
      if (depth < 4) {
        lVar24 = 0;
      }
      else {
        lVar24 = 0;
        do {
          pfVar1 = (float *)((long)pfVar20 + lVar24 * 4 + lVar3 * lVar28);
          fVar4 = pfVar1[1];
          fVar5 = pfVar1[2];
          fVar6 = pfVar1[3];
          pfVar2 = (float *)((long)pfVar20 + lVar24 * 4 + lVar3 * lVar31);
          fVar7 = *pfVar2;
          fVar8 = pfVar2[1];
          fVar9 = pfVar2[2];
          fVar10 = pfVar2[3];
          pfVar2 = (float *)((long)pfVar20 + lVar24 * 4 + lVar3 * lVar22);
          fVar11 = *pfVar2;
          fVar12 = pfVar2[1];
          fVar13 = pfVar2[2];
          fVar14 = pfVar2[3];
          pfVar2 = (float *)((long)pfVar20 + lVar24 * 4 + lVar3 * lVar23);
          fVar15 = *pfVar2;
          fVar16 = pfVar2[1];
          fVar17 = pfVar2[2];
          fVar18 = pfVar2[3];
          pfVar2 = blockB + lVar25;
          *pfVar2 = *pfVar1;
          pfVar2[1] = fVar7;
          pfVar2[2] = fVar11;
          pfVar2[3] = fVar15;
          pfVar1 = blockB + lVar25 + 4;
          *pfVar1 = fVar4;
          pfVar1[1] = fVar8;
          pfVar1[2] = fVar12;
          pfVar1[3] = fVar16;
          pfVar1 = blockB + lVar25 + 8;
          *pfVar1 = fVar5;
          pfVar1[1] = fVar9;
          pfVar1[2] = fVar13;
          pfVar1[3] = fVar17;
          pfVar1 = blockB + lVar25 + 0xc;
          *pfVar1 = fVar6;
          pfVar1[1] = fVar10;
          pfVar1[2] = fVar14;
          pfVar1[3] = fVar18;
          lVar25 = lVar25 + 0x10;
          lVar24 = lVar24 + 4;
        } while (lVar24 < (long)(uVar26 & 0xfffffffffffffffc));
      }
      lVar21 = depth - lVar24;
      if (lVar21 != 0 && lVar24 <= depth) {
        lVar30 = 0;
        do {
          blockB[lVar25 + lVar30] = *(float *)((long)pfVar20 + lVar30 + lVar3 * lVar28 + lVar24 * 4)
          ;
          blockB[lVar25 + lVar30 + 1] =
               *(float *)((long)pfVar20 + lVar30 + lVar3 * lVar31 + lVar24 * 4);
          blockB[lVar25 + lVar30 + 2] =
               *(float *)((long)pfVar20 + lVar30 + lVar3 * lVar22 + lVar24 * 4);
          blockB[lVar25 + lVar30 + 3] =
               *(float *)((long)pfVar20 + lVar30 + lVar3 * lVar23 + lVar24 * 4);
          lVar30 = lVar30 + 4;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        lVar25 = lVar25 + lVar30;
      }
      lVar29 = lVar29 + 4;
      lVar23 = lVar23 + 0x10;
      lVar22 = lVar22 + 0x10;
      lVar31 = lVar31 + 0x10;
      lVar28 = lVar28 + 0x10;
    } while (lVar29 < (long)uVar27);
  }
  if ((long)uVar27 < cols) {
    lVar22 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
    pfVar20 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data +
              ((long)uVar19 >> 2) * lVar22 * 4;
    do {
      if (0 < depth) {
        lVar23 = 0;
        do {
          blockB[lVar25 + lVar23] = pfVar20[lVar23];
          lVar23 = lVar23 + 1;
        } while (depth != lVar23);
        lVar25 = lVar25 + lVar23;
      }
      uVar27 = uVar27 + 1;
      pfVar20 = pfVar20 + lVar22;
    } while (uVar27 != cols);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enable vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0           ] = dm0.template loadPacket<Packet>(k);
          kernel.packet[1%PacketSize] = dm1.template loadPacket<Packet>(k);
          kernel.packet[2%PacketSize] = dm2.template loadPacket<Packet>(k);
          kernel.packet[3%PacketSize] = dm3.template loadPacket<Packet>(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}